

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::TreeEnsembleClassifier::_InternalParse
          (TreeEnsembleClassifier *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  TreeEnsembleParameters *msg;
  uint64_t uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint uVar3;
  char cVar4;
  uint32_t tag;
  char *local_40;
  uint local_34;
  
  local_40 = ptr;
LAB_0024edc3:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_40);
    if (bVar1) {
      return local_40;
    }
    local_40 = google::protobuf::internal::ReadTag(local_40,&local_34,0);
    tag_00 = local_34;
    uVar3 = local_34 >> 3;
    cVar4 = (char)local_34;
    if (uVar3 == 0x65) {
      if (cVar4 == '*') {
        msg = (TreeEnsembleParameters *)_internal_mutable_int64classlabels(this);
        goto LAB_0024ee51;
      }
LAB_0024ee63:
      if ((local_34 == 0) || ((local_34 & 7) == 4)) {
        if (local_40 == (char *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
        return local_40;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>
                          (&(this->super_MessageLite)._internal_metadata_);
      local_40 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_40,ctx);
    }
    else {
      if (uVar3 == 2) {
        if (cVar4 != '\x10') goto LAB_0024ee63;
        uVar2 = google::protobuf::internal::ReadVarint64(&local_40);
        if (local_40 == (char *)0x0) {
          return (char *)0x0;
        }
        this->postevaluationtransform_ = (int)uVar2;
        goto LAB_0024edc3;
      }
      if (uVar3 == 100) {
        if (cVar4 != '\"') goto LAB_0024ee63;
        msg = (TreeEnsembleParameters *)_internal_mutable_stringclasslabels(this);
      }
      else {
        if ((uVar3 != 1) || (cVar4 != '\n')) goto LAB_0024ee63;
        msg = _internal_mutable_treeensemble(this);
      }
LAB_0024ee51:
      local_40 = google::protobuf::internal::ParseContext::ParseMessage
                           (ctx,&msg->super_MessageLite,local_40);
    }
    if (local_40 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* TreeEnsembleClassifier::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.TreeEnsembleParameters treeEnsemble = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ctx->ParseMessage(_internal_mutable_treeensemble(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.TreeEnsemblePostEvaluationTransform postEvaluationTransform = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_postevaluationtransform(static_cast<::CoreML::Specification::TreeEnsemblePostEvaluationTransform>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_stringclasslabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_int64classlabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}